

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O0

void xs::Message::parseHeader(deUint8 *data,size_t dataSize,MessageType *type,size_t *size)

{
  deBool dVar1;
  uint uVar2;
  MessageType MVar3;
  Error *this;
  undefined1 local_50 [8];
  MessageParser parser;
  size_t *size_local;
  MessageType *type_local;
  size_t dataSize_local;
  deUint8 *data_local;
  
  do {
    dVar1 = deGetFalse();
    if (dVar1 != 0 || dataSize < 8) {
      this = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this,"Incomplete header","dataSize >= MESSAGE_HEADER_SIZE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsProtocol.cpp"
                   ,0x8f);
      __cxa_throw(this,&Error::typeinfo,Error::~Error);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  MessageParser::MessageParser((MessageParser *)local_50,data,dataSize);
  uVar2 = MessageParser::get<int>((MessageParser *)local_50);
  *size = (ulong)uVar2;
  MVar3 = MessageParser::get<int>((MessageParser *)local_50);
  *type = MVar3;
  return;
}

Assistant:

void Message::parseHeader (const deUint8* data, size_t dataSize, MessageType& type, size_t& size)
{
	XS_CHECK_MSG(dataSize >= MESSAGE_HEADER_SIZE, "Incomplete header");
	MessageParser parser(data, dataSize);
	size	= (size_t)(MessageType)parser.get<int>();
	type	= (MessageType)parser.get<int>();
}